

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

bool cmsys::SystemTools::ParseURLProtocol(string *URL,string *protocol,string *dataglom,bool decode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  RegularExpression urlRe;
  string local_120;
  RegularExpression local_100;
  
  local_100.regmust = (char *)0x0;
  local_100.program = (char *)0x0;
  local_100.progsize = 0;
  memset(&local_100,0,0xaa);
  RegularExpression::compile(&local_100,"([a-zA-Z0-9]*)://(.*)");
  bVar2 = RegularExpression::find(&local_100,(URL->_M_dataplus)._M_p,&local_100.regmatch);
  if (bVar2) {
    if (local_100.regmatch.startp[1] == (char *)0x0) {
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      local_120._M_string_length = 0;
      local_120.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,local_100.regmatch.startp[1],local_100.regmatch.endp[1]);
    }
    std::__cxx11::string::operator=((string *)protocol,(string *)&local_120);
    paVar1 = &local_120.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                               local_120.field_2._M_local_buf[0]) + 1);
    }
    local_120._M_dataplus._M_p = (pointer)paVar1;
    if (local_100.regmatch.startp[2] == (char *)0x0) {
      local_120._M_string_length = 0;
      local_120.field_2._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,local_100.regmatch.startp[2],local_100.regmatch.endp[2]);
    }
    std::__cxx11::string::operator=((string *)dataglom,(string *)&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                               local_120.field_2._M_local_buf[0]) + 1);
    }
    if (decode) {
      DecodeURL(&local_120,dataglom);
      std::__cxx11::string::operator=((string *)dataglom,(string *)&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != paVar1) {
        operator_delete(local_120._M_dataplus._M_p,
                        CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                                 local_120.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  return bVar2;
}

Assistant:

bool SystemTools::ParseURLProtocol(const std::string& URL,
                                   std::string& protocol,
                                   std::string& dataglom, bool decode)
{
  // match 0 entire url
  // match 1 protocol
  // match 2 dataglom following protocol://
  kwsys::RegularExpression urlRe(VTK_URL_PROTOCOL_REGEX);

  if (!urlRe.find(URL))
    return false;

  protocol = urlRe.match(1);
  dataglom = urlRe.match(2);

  if (decode) {
    dataglom = DecodeURL(dataglom);
  }

  return true;
}